

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_unref(lua_State *L,int t,int ref)

{
  int idx;
  
  if (-1 < ref) {
    idx = lua_absindex(L,t);
    lua_rawgeti(L,idx,0);
    lua_rawseti(L,idx,ref);
    lua_pushinteger(L,(ulong)(uint)ref);
    lua_rawseti(L,idx,0);
    return;
  }
  return;
}

Assistant:

LUALIB_API void luaL_unref (lua_State *L, int t, int ref) {
  if (ref >= 0) {
    t = lua_absindex(L, t);
    lua_rawgeti(L, t, freelist);
    lua_rawseti(L, t, ref);  /* t[ref] = t[freelist] */
    lua_pushinteger(L, ref);
    lua_rawseti(L, t, freelist);  /* t[freelist] = ref */
  }
}